

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  long *plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  long *literals;
  size_t sVar11;
  long *plVar12;
  byte bVar13;
  int iVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  BYTE *pBVar18;
  U32 *hashTable;
  U32 UVar19;
  ulong uVar20;
  U32 UVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  BYTE *pBVar27;
  uint uVar28;
  long *plVar29;
  uint local_b0;
  uint local_ac;
  ulong local_80;
  ulong local_60;
  
  uVar28 = (ms->cParams).minMatch;
  pUVar6 = ms->hashTable;
  uVar2 = (ms->cParams).targetLength;
  uVar10 = (ulong)(uVar2 + 1 + (uint)(uVar2 == 0));
  pBVar7 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  pBVar27 = pBVar7 + uVar2;
  uVar3 = rep[1];
  literals = (long *)((long)src + (ulong)(pBVar27 == (BYTE *)src));
  uVar24 = (int)literals - (int)pBVar27;
  local_ac = uVar3;
  if (uVar24 < uVar3) {
    local_ac = 0;
  }
  pInLimit = (BYTE *)((long)src + srcSize);
  plVar1 = (long *)((long)src + (srcSize - 8));
  plVar29 = (long *)((long)src + (ulong)(pBVar27 == (BYTE *)src) + 1);
  uVar4 = *rep;
  local_b0 = 0;
  if (uVar4 <= uVar24) {
    local_b0 = uVar4;
  }
  iVar14 = (int)pBVar7;
  cVar9 = (char)(ms->cParams).hashLog;
  if (uVar28 == 5) {
    bVar13 = 0x40 - cVar9;
    do {
      do {
        lVar17 = -(ulong)local_b0;
        while( true ) {
          if (plVar1 <= plVar29) goto LAB_0010f8e1;
          lVar16 = *literals;
          uVar23 = (ulong)(lVar16 * -0x30e4432345000000) >> (bVar13 & 0x3f);
          lVar8 = *plVar29;
          uVar26 = (ulong)(lVar8 * -0x30e4432345000000) >> (bVar13 & 0x3f);
          uVar20 = (long)literals - (long)pBVar7;
          uVar28 = pUVar6[uVar23];
          uVar5 = pUVar6[uVar26];
          UVar19 = (U32)uVar20;
          pUVar6[uVar23] = UVar19;
          pUVar6[uVar26] = (int)plVar29 - iVar14;
          if ((local_b0 != 0) &&
             (*(int *)((long)literals + lVar17 + 2) == *(int *)((long)literals + 2))) {
            uVar23 = (ulong)(*(char *)((long)literals + 1) == *(char *)((long)literals + lVar17 + 1)
                            );
            plVar29 = (long *)((long)literals + (2 - uVar23));
            pBVar18 = (BYTE *)(lVar17 + (long)plVar29);
            UVar21 = 0;
            goto LAB_0010f52e;
          }
          if (((uVar2 < uVar28) &&
              (piVar15 = (int *)(pBVar7 + uVar28), plVar12 = literals, *piVar15 == (int)lVar16)) ||
             ((uVar2 < uVar5 &&
              (piVar15 = (int *)(pBVar7 + uVar5), plVar12 = plVar29, *piVar15 == (int)lVar8))))
          break;
          lVar16 = ((long)literals - (long)src >> 7) + uVar10;
          literals = (long *)((long)literals + lVar16);
          plVar29 = (long *)((long)plVar29 + lVar16);
        }
        uVar28 = (int)plVar12 - (int)piVar15;
        UVar21 = uVar28 + 2;
        lVar17 = 0;
        while( true ) {
          pBVar18 = (BYTE *)((long)piVar15 + lVar17);
          plVar29 = (long *)((long)plVar12 + lVar17);
          if (((pBVar18 <= pBVar27) || (plVar29 <= src)) ||
             (*(char *)((long)plVar12 + lVar17 + -1) != *(char *)((long)piVar15 + lVar17 + -1)))
          break;
          lVar17 = lVar17 + -1;
        }
        uVar23 = -lVar17;
        local_ac = local_b0;
        local_b0 = uVar28;
LAB_0010f52e:
        local_80 = (ulong)local_b0;
        sVar11 = ZSTD_count((BYTE *)((long)plVar29 + uVar23 + 4),pBVar18 + uVar23 + 4,pInLimit);
        ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,UVar21,sVar11 + uVar23 + 1);
        lVar17 = (long)plVar29 + sVar11 + uVar23;
        literals = (long *)(lVar17 + 4);
        plVar29 = (long *)((long)plVar29 + sVar11 + uVar23 + 5);
        src = literals;
      } while (plVar1 < literals);
      pUVar6[(ulong)(*(long *)(pBVar7 + (uVar20 & 0xffffffff) + 2) * -0x30e4432345000000) >>
             (bVar13 & 0x3f)] = UVar19 + 2;
      pUVar6[(ulong)(*(long *)(lVar17 + 2) * -0x30e4432345000000) >> (bVar13 & 0x3f)] =
           ((int)lVar17 + 2) - iVar14;
      while( true ) {
        uVar20 = (ulong)local_ac;
        local_b0 = (uint)local_80;
        src = literals;
        if (plVar1 < literals) break;
        if ((local_ac == 0) || ((int)*literals != *(int *)((long)literals - uVar20))) break;
        sVar11 = ZSTD_count((BYTE *)((long)literals + 4),(BYTE *)((long)literals + (4 - uVar20)),
                            pInLimit);
        pUVar6[(ulong)(*literals * -0x30e4432345000000) >> (bVar13 & 0x3f)] = (int)literals - iVar14
        ;
        plVar29 = (long *)((long)literals + sVar11 + 5);
        ZSTD_storeSeq(seqStore,0,literals,0,sVar11 + 1);
        literals = (long *)((long)literals + sVar11 + 4);
        local_80 = uVar20;
        local_ac = local_b0;
      }
    } while( true );
  }
  if (uVar28 == 6) {
    bVar13 = 0x40 - cVar9;
    do {
      do {
        lVar17 = -(ulong)local_b0;
        while( true ) {
          if (plVar1 <= plVar29) goto LAB_0010f8e1;
          lVar16 = *literals;
          uVar23 = (ulong)(lVar16 * -0x30e4432340650000) >> (bVar13 & 0x3f);
          lVar8 = *plVar29;
          uVar26 = (ulong)(lVar8 * -0x30e4432340650000) >> (bVar13 & 0x3f);
          uVar20 = (long)literals - (long)pBVar7;
          uVar28 = pUVar6[uVar23];
          uVar5 = pUVar6[uVar26];
          UVar19 = (U32)uVar20;
          pUVar6[uVar23] = UVar19;
          pUVar6[uVar26] = (int)plVar29 - iVar14;
          if ((local_b0 != 0) &&
             (*(int *)((long)literals + lVar17 + 2) == *(int *)((long)literals + 2))) {
            uVar23 = (ulong)(*(char *)((long)literals + 1) == *(char *)((long)literals + lVar17 + 1)
                            );
            plVar29 = (long *)((long)literals + (2 - uVar23));
            pBVar18 = (BYTE *)(lVar17 + (long)plVar29);
            UVar21 = 0;
            goto LAB_0010f2b8;
          }
          if (((uVar2 < uVar28) &&
              (piVar15 = (int *)(pBVar7 + uVar28), plVar12 = literals, *piVar15 == (int)lVar16)) ||
             ((uVar2 < uVar5 &&
              (piVar15 = (int *)(pBVar7 + uVar5), plVar12 = plVar29, *piVar15 == (int)lVar8))))
          break;
          lVar16 = ((long)literals - (long)src >> 7) + uVar10;
          literals = (long *)((long)literals + lVar16);
          plVar29 = (long *)((long)plVar29 + lVar16);
        }
        uVar28 = (int)plVar12 - (int)piVar15;
        UVar21 = uVar28 + 2;
        lVar17 = 0;
        while( true ) {
          pBVar18 = (BYTE *)((long)piVar15 + lVar17);
          plVar29 = (long *)((long)plVar12 + lVar17);
          if (((pBVar18 <= pBVar27) || (plVar29 <= src)) ||
             (*(char *)((long)plVar12 + lVar17 + -1) != *(char *)((long)piVar15 + lVar17 + -1)))
          break;
          lVar17 = lVar17 + -1;
        }
        uVar23 = -lVar17;
        local_ac = local_b0;
        local_b0 = uVar28;
LAB_0010f2b8:
        local_60 = (ulong)local_b0;
        sVar11 = ZSTD_count((BYTE *)((long)plVar29 + uVar23 + 4),pBVar18 + uVar23 + 4,pInLimit);
        ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,UVar21,sVar11 + uVar23 + 1);
        lVar17 = (long)plVar29 + sVar11 + uVar23;
        literals = (long *)(lVar17 + 4);
        plVar29 = (long *)((long)plVar29 + sVar11 + uVar23 + 5);
        src = literals;
      } while (plVar1 < literals);
      pUVar6[(ulong)(*(long *)(pBVar7 + (uVar20 & 0xffffffff) + 2) * -0x30e4432340650000) >>
             (bVar13 & 0x3f)] = UVar19 + 2;
      pUVar6[(ulong)(*(long *)(lVar17 + 2) * -0x30e4432340650000) >> (bVar13 & 0x3f)] =
           ((int)lVar17 + 2) - iVar14;
      while( true ) {
        uVar20 = (ulong)local_ac;
        local_b0 = (uint)local_60;
        src = literals;
        if (plVar1 < literals) break;
        if ((local_ac == 0) || ((int)*literals != *(int *)((long)literals - uVar20))) break;
        sVar11 = ZSTD_count((BYTE *)((long)literals + 4),(BYTE *)((long)literals + (4 - uVar20)),
                            pInLimit);
        pUVar6[(ulong)(*literals * -0x30e4432340650000) >> (bVar13 & 0x3f)] = (int)literals - iVar14
        ;
        plVar29 = (long *)((long)literals + sVar11 + 5);
        ZSTD_storeSeq(seqStore,0,literals,0,sVar11 + 1);
        literals = (long *)((long)literals + sVar11 + 4);
        local_60 = uVar20;
        local_ac = local_b0;
      }
    } while( true );
  }
  if (uVar28 != 7) {
    bVar13 = 0x20 - cVar9;
    do {
      do {
        lVar17 = -(ulong)local_b0;
        while( true ) {
          if (plVar1 <= plVar29) goto LAB_0010f8e1;
          lVar16 = *literals;
          uVar22 = (uint)((int)lVar16 * -0x61c8864f) >> (bVar13 & 0x1f);
          lVar8 = *plVar29;
          uVar25 = (uint)((int)lVar8 * -0x61c8864f) >> (bVar13 & 0x1f);
          uVar20 = (long)literals - (long)pBVar7;
          uVar28 = pUVar6[uVar22];
          uVar5 = pUVar6[uVar25];
          UVar19 = (U32)uVar20;
          pUVar6[uVar22] = UVar19;
          pUVar6[uVar25] = (int)plVar29 - iVar14;
          if ((local_b0 != 0) &&
             (*(int *)((long)literals + lVar17 + 2) == *(int *)((long)literals + 2))) {
            uVar23 = (ulong)(*(char *)((long)literals + 1) == *(char *)((long)literals + lVar17 + 1)
                            );
            plVar29 = (long *)((long)literals + (2 - uVar23));
            pBVar18 = (BYTE *)(lVar17 + (long)plVar29);
            UVar21 = 0;
            goto LAB_0010f7b4;
          }
          if (((uVar2 < uVar28) &&
              (piVar15 = (int *)(pBVar7 + uVar28), plVar12 = literals, *piVar15 == (int)lVar16)) ||
             ((uVar2 < uVar5 &&
              (piVar15 = (int *)(pBVar7 + uVar5), plVar12 = plVar29, *piVar15 == (int)lVar8))))
          break;
          lVar16 = ((long)literals - (long)src >> 7) + uVar10;
          literals = (long *)((long)literals + lVar16);
          plVar29 = (long *)((long)plVar29 + lVar16);
        }
        uVar28 = (int)plVar12 - (int)piVar15;
        UVar21 = uVar28 + 2;
        lVar17 = 0;
        while( true ) {
          pBVar18 = (BYTE *)((long)piVar15 + lVar17);
          plVar29 = (long *)((long)plVar12 + lVar17);
          if (((pBVar18 <= pBVar27) || (plVar29 <= src)) ||
             (*(char *)((long)plVar12 + lVar17 + -1) != *(char *)((long)piVar15 + lVar17 + -1)))
          break;
          lVar17 = lVar17 + -1;
        }
        uVar23 = -lVar17;
        local_ac = local_b0;
        local_b0 = uVar28;
LAB_0010f7b4:
        sVar11 = ZSTD_count((BYTE *)((long)plVar29 + uVar23 + 4),pBVar18 + uVar23 + 4,pInLimit);
        ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,UVar21,sVar11 + uVar23 + 1);
        lVar17 = (long)plVar29 + sVar11 + uVar23;
        literals = (long *)(lVar17 + 4);
        plVar29 = (long *)((long)plVar29 + sVar11 + uVar23 + 5);
        src = literals;
      } while (plVar1 < literals);
      pUVar6[(uint)(*(int *)(pBVar7 + (uVar20 & 0xffffffff) + 2) * -0x61c8864f) >> (bVar13 & 0x1f)]
           = UVar19 + 2;
      pUVar6[(uint)(*(int *)(lVar17 + 2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
           ((int)lVar17 + 2) - iVar14;
      uVar28 = local_b0;
      for (; local_b0 = uVar28, src = literals, literals <= plVar1;
          literals = (long *)((long)literals + sVar11 + 4)) {
        lVar17 = *literals;
        if ((local_ac == 0) || ((int)lVar17 != *(int *)((long)literals - (ulong)local_ac))) break;
        sVar11 = ZSTD_count((BYTE *)((long)literals + 4),
                            (BYTE *)((long)literals + (4 - (ulong)local_ac)),pInLimit);
        pUVar6[(uint)((int)lVar17 * -0x61c8864f) >> (bVar13 & 0x1f)] = (int)literals - iVar14;
        plVar29 = (long *)((long)literals + sVar11 + 5);
        ZSTD_storeSeq(seqStore,0,literals,0,sVar11 + 1);
        uVar28 = local_ac;
        local_ac = local_b0;
      }
    } while( true );
  }
  bVar13 = 0x40 - cVar9;
LAB_0010ef0e:
  lVar17 = -(ulong)local_b0;
  do {
    if (plVar1 <= plVar29) {
LAB_0010f8e1:
      uVar28 = 0;
      if (uVar24 < uVar3) {
        uVar28 = uVar3;
      }
      if (uVar24 < uVar4) {
        uVar28 = uVar4;
      }
      if (local_b0 == 0) {
        local_b0 = uVar28;
      }
      if (local_ac != 0) {
        uVar28 = local_ac;
      }
      *rep = local_b0;
      rep[1] = uVar28;
      return (long)pInLimit - (long)src;
    }
    lVar16 = *literals;
    uVar23 = (ulong)(lVar16 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
    lVar8 = *plVar29;
    uVar26 = (ulong)(lVar8 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
    uVar20 = (long)literals - (long)pBVar7;
    uVar28 = pUVar6[uVar23];
    uVar5 = pUVar6[uVar26];
    UVar19 = (U32)uVar20;
    pUVar6[uVar23] = UVar19;
    pUVar6[uVar26] = (int)plVar29 - iVar14;
    if ((local_b0 != 0) && (*(int *)((long)literals + lVar17 + 2) == *(int *)((long)literals + 2)))
    {
      uVar23 = (ulong)(*(char *)((long)literals + 1) == *(char *)((long)literals + lVar17 + 1));
      plVar29 = (long *)((long)literals + (2 - uVar23));
      pBVar18 = (BYTE *)(lVar17 + (long)plVar29);
      UVar21 = 0;
      goto LAB_0010f02c;
    }
    if (((uVar2 < uVar28) &&
        (piVar15 = (int *)(pBVar7 + uVar28), plVar12 = literals, *piVar15 == (int)lVar16)) ||
       ((uVar2 < uVar5 &&
        (piVar15 = (int *)(pBVar7 + uVar5), plVar12 = plVar29, *piVar15 == (int)lVar8)))) break;
    lVar16 = ((long)literals - (long)src >> 7) + uVar10;
    literals = (long *)((long)literals + lVar16);
    plVar29 = (long *)((long)plVar29 + lVar16);
  } while( true );
  uVar28 = (int)plVar12 - (int)piVar15;
  UVar21 = uVar28 + 2;
  lVar17 = 0;
  while( true ) {
    pBVar18 = (BYTE *)((long)piVar15 + lVar17);
    plVar29 = (long *)((long)plVar12 + lVar17);
    if (((pBVar18 <= pBVar27) || (plVar29 <= src)) ||
       (*(char *)((long)plVar12 + lVar17 + -1) != *(char *)((long)piVar15 + lVar17 + -1))) break;
    lVar17 = lVar17 + -1;
  }
  uVar23 = -lVar17;
  local_ac = local_b0;
  local_b0 = uVar28;
LAB_0010f02c:
  sVar11 = ZSTD_count((BYTE *)((long)plVar29 + uVar23 + 4),pBVar18 + uVar23 + 4,pInLimit);
  ZSTD_storeSeq(seqStore,(long)plVar29 - (long)src,src,UVar21,sVar11 + uVar23 + 1);
  lVar17 = (long)plVar29 + sVar11 + uVar23;
  literals = (long *)(lVar17 + 4);
  plVar29 = (long *)((long)plVar29 + sVar11 + uVar23 + 5);
  src = literals;
  if (literals <= plVar1) {
    pUVar6[(ulong)(*(long *)(pBVar7 + (uVar20 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
           (bVar13 & 0x3f)] = UVar19 + 2;
    pUVar6[(ulong)(*(long *)(lVar17 + 2) * -0x30e44323405a9d00) >> (bVar13 & 0x3f)] =
         ((int)lVar17 + 2) - iVar14;
    uVar28 = local_b0;
    for (; local_b0 = uVar28, src = literals, literals <= plVar1;
        literals = (long *)((long)literals + sVar11 + 4)) {
      if ((local_ac == 0) || ((int)*literals != *(int *)((long)literals - (ulong)local_ac))) break;
      sVar11 = ZSTD_count((BYTE *)((long)literals + 4),
                          (BYTE *)((long)literals + (4 - (ulong)local_ac)),pInLimit);
      pUVar6[(ulong)(*literals * -0x30e44323405a9d00) >> (bVar13 & 0x3f)] = (int)literals - iVar14;
      plVar29 = (long *)((long)literals + sVar11 + 5);
      ZSTD_storeSeq(seqStore,0,literals,0,sVar11 + 1);
      uVar28 = local_ac;
      local_ac = local_b0;
    }
  }
  goto LAB_0010ef0e;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}